

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionEntryPointInfo::ReleasePendingWorkItem(FunctionEntryPointInfo *this)

{
  code *pcVar1;
  State SVar2;
  bool bVar3;
  CodeGenWorkItem *workItem;
  undefined4 *puVar4;
  JavascriptLibrary *pJVar5;
  
  SVar2 = EntryPointInfo::GetState(&this->super_EntryPointInfo);
  if (SVar2 != NotScheduled) {
    SVar2 = EntryPointInfo::GetState(&this->super_EntryPointInfo);
    if (SVar2 != CleanedUp) {
      workItem = EntryPointInfo::GetWorkItem(&this->super_EntryPointInfo);
      if (workItem != (CodeGenWorkItem *)0x0) {
        pJVar5 = (this->super_EntryPointInfo).library.ptr;
        if (pJVar5 == (JavascriptLibrary *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                      ,0x23cf,"(this->library != nullptr)",
                                      "this->library != nullptr");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
          pJVar5 = (this->super_EntryPointInfo).library.ptr;
        }
        TryReleaseNonHiPriWorkItem((pJVar5->super_JavascriptLibraryBase).scriptContext.ptr,workItem)
        ;
        return;
      }
    }
  }
  return;
}

Assistant:

void FunctionEntryPointInfo::ReleasePendingWorkItem()
    {
        // Do this outside of Cleanup since cleanup can be called from the background thread
        // We remove any work items corresponding to the function body being reclaimed
        // so that the background thread doesn't try to use them. ScriptContext != null => this
        // is a function entry point
        // In general this is not needed for loop bodies since loop bodies aren't in the low priority
        // queue, they should be jitted before the entry point is finalized
        if (!this->IsNotScheduled() && !this->IsCleanedUp())
        {
#if defined(_M_ARM32_OR_ARM64)
            // On ARM machines, order of writes is not guaranteed while reading data from another processor
            // So we need to have a memory barrier here in order to make sure that the work item is consistent
            MemoryBarrier();
#endif
            CodeGenWorkItem* workItem = this->GetWorkItem();
            if (workItem != nullptr)
            {
                Assert(this->library != nullptr);
#if ENABLE_NATIVE_CODEGEN
                TryReleaseNonHiPriWorkItem(this->library->GetScriptContext(), workItem);
#endif
            }
        }
    }